

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptProxy::GetAccessors
          (JavascriptProxy *this,PropertyId propertyId,Var *getter,Var *setter,
          ScriptContext *requestContext)

{
  uint uVar1;
  Var pvVar2;
  undefined1 local_60 [8];
  PropertyDescriptor result;
  
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_60);
  if (getter != (Var *)0x0) {
    *getter = (Var)0x0;
  }
  if (setter != (Var *)0x0) {
    *setter = (Var)0x0;
  }
  uVar1 = GetOwnPropertyDescriptor
                    ((RecyclableObject *)this,propertyId,requestContext,
                     (PropertyDescriptor *)local_60);
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else if (result.enumerableSpecified == true) {
    if ((getter != (Var *)0x0) && (result.originalVar.ptr._4_1_ != '\0')) {
      pvVar2 = PropertyDescriptor::GetGetter((PropertyDescriptor *)local_60);
      *getter = pvVar2;
    }
    if ((setter != (Var *)0x0) && (result.originalVar.ptr._5_1_ != 0)) {
      pvVar2 = PropertyDescriptor::GetSetter((PropertyDescriptor *)local_60);
      *setter = pvVar2;
    }
    if (result.originalVar.ptr._4_1_ == '\0') {
      uVar1 = (uint)result.originalVar.ptr._5_1_;
    }
    else {
      uVar1 = 1;
    }
  }
  return uVar1;
}

Assistant:

BOOL JavascriptProxy::GetAccessors(PropertyId propertyId, _Outptr_result_maybenull_ Var* getter, _Outptr_result_maybenull_ Var* setter, ScriptContext* requestContext)
    {
        PropertyDescriptor result;
        if (getter != nullptr)
        {
            *getter = nullptr;
        }

        if (setter != nullptr)
        {
            *setter = nullptr;
        }

        BOOL foundProperty = GetOwnPropertyDescriptor(this, propertyId, requestContext, &result);
        if (foundProperty && result.IsFromProxy())
        {
            if (result.GetterSpecified() && getter != nullptr)
            {
                *getter = result.GetGetter();
            }
            if (result.SetterSpecified() && setter != nullptr)
            {
                *setter = result.GetSetter();
            }
            foundProperty = result.GetterSpecified() || result.SetterSpecified();
        }
        return foundProperty;
    }